

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O0

REF_STATUS
ref_gather_cell_quality_tec
          (REF_NODE ref_node,REF_CELL ref_cell,REF_LONG ncell_expected,REF_GLOB *l2c,
          REF_DBL min_quality,FILE *file)

{
  REF_MPI ref_mpi_00;
  REF_STATUS RVar1;
  uint uVar2;
  long lVar3;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL quality;
  REF_LONG ncell_actual;
  REF_INT proc;
  REF_INT part;
  REF_GLOB *c2n;
  REF_INT ncell;
  REF_INT node_per;
  REF_GLOB globals [27];
  REF_INT local_c8 [2];
  REF_INT nodes [27];
  int local_50;
  int local_4c;
  REF_INT node;
  REF_INT cell;
  REF_MPI ref_mpi;
  FILE *file_local;
  REF_DBL min_quality_local;
  REF_GLOB *l2c_local;
  REF_LONG ncell_expected_local;
  REF_CELL ref_cell_local;
  REF_NODE ref_node_local;
  
  ref_mpi_00 = ref_node->ref_mpi;
  c2n._4_4_ = ref_cell->node_per;
  quality = 0.0;
  if (ref_mpi_00->id == 0) {
    for (local_4c = 0; local_4c < ref_cell->max; local_4c = local_4c + 1) {
      RVar1 = ref_cell_nodes(ref_cell,local_4c,local_c8);
      if (RVar1 == 0) {
        uVar2 = ref_cell_part(ref_cell,ref_node,local_4c,(REF_INT *)((long)&ncell_actual + 4));
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x2f9,"ref_gather_cell_quality_tec",(ulong)uVar2,"part");
          return uVar2;
        }
        if (ref_mpi_00->id == ncell_actual._4_4_) {
          uVar2 = ref_node_tet_quality(ref_node,local_c8,(REF_DBL *)&ref_private_macro_code_rss_1);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x2fb,"ref_gather_cell_quality_tec",(ulong)uVar2,"qual");
            return uVar2;
          }
          if (_ref_private_macro_code_rss_1 < min_quality) {
            for (local_50 = 0; local_50 < c2n._4_4_; local_50 = local_50 + 1) {
              *(REF_GLOB *)(&ncell + (long)local_50 * 2) = l2c[local_c8[local_50]];
              *(long *)(&ncell + (long)local_50 * 2) = *(long *)(&ncell + (long)local_50 * 2) + 1;
              fprintf((FILE *)file," %ld",*(undefined8 *)(&ncell + (long)local_50 * 2));
            }
            quality = (REF_DBL)((long)quality + 1);
            fprintf((FILE *)file,"\n");
          }
        }
      }
    }
  }
  if (ref_mpi_00->id == 0) {
    for (ncell_actual._0_4_ = 1; (int)ncell_actual < ref_mpi_00->n;
        ncell_actual._0_4_ = (int)ncell_actual + 1) {
      uVar2 = ref_mpi_gather_recv(ref_mpi_00,&c2n,1,1,(int)ncell_actual);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x30c,"ref_gather_cell_quality_tec",(ulong)uVar2,"recv ncell");
        return uVar2;
      }
      if ((int)c2n * c2n._4_4_ < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x30d,"ref_gather_cell_quality_tec","malloc c2n of REF_GLOB negative");
        return 1;
      }
      _proc = malloc((long)((int)c2n * c2n._4_4_) << 3);
      if (_proc == (void *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x30d,"ref_gather_cell_quality_tec","malloc c2n of REF_GLOB NULL");
        return 2;
      }
      uVar2 = ref_mpi_gather_recv(ref_mpi_00,_proc,(int)c2n * c2n._4_4_,2,(int)ncell_actual);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x310,"ref_gather_cell_quality_tec",(ulong)uVar2,"recv c2n");
        return uVar2;
      }
      for (local_4c = 0; local_4c < (int)c2n; local_4c = local_4c + 1) {
        for (local_50 = 0; local_50 < c2n._4_4_; local_50 = local_50 + 1) {
          lVar3 = (long)(local_50 + c2n._4_4_ * local_4c);
          *(long *)((long)_proc + lVar3 * 8) = *(long *)((long)_proc + lVar3 * 8) + 1;
          fprintf((FILE *)file," %ld",
                  *(undefined8 *)((long)_proc + (long)(local_50 + c2n._4_4_ * local_4c) * 8));
        }
        fprintf((FILE *)file,"\n");
      }
      quality = (REF_DBL)((long)quality + 1);
      if (_proc != (void *)0x0) {
        free(_proc);
      }
    }
  }
  else {
    c2n._0_4_ = 0;
    for (local_4c = 0; local_4c < ref_cell->max; local_4c = local_4c + 1) {
      RVar1 = ref_cell_nodes(ref_cell,local_4c,local_c8);
      if (RVar1 == 0) {
        uVar2 = ref_cell_part(ref_cell,ref_node,local_4c,(REF_INT *)((long)&ncell_actual + 4));
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x31e,"ref_gather_cell_quality_tec",(ulong)uVar2,"part");
          return uVar2;
        }
        if (ref_mpi_00->id == ncell_actual._4_4_) {
          uVar2 = ref_node_tet_quality(ref_node,local_c8,(REF_DBL *)&ref_private_macro_code_rss_1);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,800,"ref_gather_cell_quality_tec",(ulong)uVar2,"qual");
            return uVar2;
          }
          if (_ref_private_macro_code_rss_1 < min_quality) {
            c2n._0_4_ = (int)c2n + 1;
          }
        }
      }
    }
    uVar2 = ref_mpi_gather_send(ref_mpi_00,&c2n,1,1);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x324,"ref_gather_cell_quality_tec",(ulong)uVar2,"send ncell");
      return uVar2;
    }
    if ((int)c2n * c2n._4_4_ < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x325,"ref_gather_cell_quality_tec","malloc c2n of REF_GLOB negative");
      return 1;
    }
    _proc = malloc((long)((int)c2n * c2n._4_4_) << 3);
    if (_proc == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x325,"ref_gather_cell_quality_tec","malloc c2n of REF_GLOB NULL");
      return 2;
    }
    c2n._0_4_ = 0;
    for (local_4c = 0; local_4c < ref_cell->max; local_4c = local_4c + 1) {
      RVar1 = ref_cell_nodes(ref_cell,local_4c,local_c8);
      if (RVar1 == 0) {
        uVar2 = ref_cell_part(ref_cell,ref_node,local_4c,(REF_INT *)((long)&ncell_actual + 4));
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x328,"ref_gather_cell_quality_tec",(ulong)uVar2,"part");
          return uVar2;
        }
        if (ref_mpi_00->id == ncell_actual._4_4_) {
          uVar2 = ref_node_tet_quality(ref_node,local_c8,(REF_DBL *)&ref_private_macro_code_rss_1);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x32a,"ref_gather_cell_quality_tec",(ulong)uVar2,"qual");
            return uVar2;
          }
          if (_ref_private_macro_code_rss_1 < min_quality) {
            for (local_50 = 0; local_50 < c2n._4_4_; local_50 = local_50 + 1) {
              *(REF_GLOB *)((long)_proc + (long)(local_50 + c2n._4_4_ * (int)c2n) * 8) =
                   l2c[local_c8[local_50]];
            }
            c2n._0_4_ = (int)c2n + 1;
          }
        }
      }
    }
    uVar2 = ref_mpi_gather_send(ref_mpi_00,_proc,(int)c2n * c2n._4_4_,2);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x333,"ref_gather_cell_quality_tec",(ulong)uVar2,"send c2n");
      return uVar2;
    }
    if (_proc != (void *)0x0) {
      free(_proc);
    }
  }
  if ((ref_mpi_00->id == 0) && ((REF_DBL)ncell_expected != quality)) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x338,
           "ref_gather_cell_quality_tec","cell count mismatch",ncell_expected,quality);
    ref_node_local._4_4_ = 1;
  }
  else {
    ref_node_local._4_4_ = 0;
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_cell_quality_tec(
    REF_NODE ref_node, REF_CELL ref_cell, REF_LONG ncell_expected,
    REF_GLOB *l2c, REF_DBL min_quality, FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT cell, node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_GLOB globals[REF_CELL_MAX_SIZE_PER];
  REF_INT node_per = ref_cell_node_per(ref_cell);
  REF_INT ncell;
  REF_GLOB *c2n;
  REF_INT part, proc;
  REF_LONG ncell_actual;
  REF_DBL quality;

  ncell_actual = 0;

  if (ref_mpi_once(ref_mpi)) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
      if (ref_mpi_rank(ref_mpi) == part) {
        RSS(ref_node_tet_quality(ref_node, nodes, &quality), "qual");
        if (quality < min_quality) {
          for (node = 0; node < node_per; node++) {
            globals[node] = l2c[nodes[node]];
            globals[node]++;
            fprintf(file, " " REF_GLOB_FMT, globals[node]);
          }
          ncell_actual++;
          fprintf(file, "\n");
        }
      }
    }
  }

  if (ref_mpi_once(ref_mpi)) {
    each_ref_mpi_worker(ref_mpi, proc) {
      RSS(ref_mpi_gather_recv(ref_mpi, &ncell, 1, REF_INT_TYPE, proc),
          "recv ncell");
      ref_malloc(c2n, ncell * node_per, REF_GLOB);
      RSS(ref_mpi_gather_recv(ref_mpi, c2n, ncell * node_per, REF_GLOB_TYPE,
                              proc),
          "recv c2n");
      for (cell = 0; cell < ncell; cell++) {
        for (node = 0; node < node_per; node++) {
          c2n[node + node_per * cell]++;
          fprintf(file, " " REF_GLOB_FMT, c2n[node + node_per * cell]);
        }
        fprintf(file, "\n");
      }
      ncell_actual++;
      ref_free(c2n);
    }
  } else {
    ncell = 0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
      if (ref_mpi_rank(ref_mpi) == part) {
        RSS(ref_node_tet_quality(ref_node, nodes, &quality), "qual");
        if (quality < min_quality) ncell++;
      }
    }
    RSS(ref_mpi_gather_send(ref_mpi, &ncell, 1, REF_INT_TYPE), "send ncell");
    ref_malloc(c2n, ncell * node_per, REF_GLOB);
    ncell = 0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
      if (ref_mpi_rank(ref_mpi) == part) {
        RSS(ref_node_tet_quality(ref_node, nodes, &quality), "qual");
        if (quality < min_quality) {
          for (node = 0; node < node_per; node++)
            c2n[node + node_per * ncell] = l2c[nodes[node]];
          ncell++;
        }
      }
    }
    RSS(ref_mpi_gather_send(ref_mpi, c2n, ncell * node_per, REF_GLOB_TYPE),
        "send c2n");
    ref_free(c2n);
  }

  if (ref_mpi_once(ref_mpi)) {
    REIS(ncell_expected, ncell_actual, "cell count mismatch");
  }

  return REF_SUCCESS;
}